

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,__1,__1> * __thiscall
Matrix<double,_-1,_-1>::operator=(Matrix<double,__1,__1> *this,Matrix<double,__1,__1> matrix)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  int j;
  int col;
  Matrix<double,__1,__1> matrix_local;
  
  matrix_local.data = matrix.data;
  uVar4 = matrix._0_8_;
  if (&matrix_local != this) {
    matrix_local._0_8_ = uVar4;
    if (this->data == (double *)0x0) {
      iVar2 = matrix.cols;
    }
    else {
      operator_delete__(this->data);
      uVar4 = matrix_local._0_8_ & 0xffffffff;
      iVar2 = matrix_local.cols;
    }
    this->cols = iVar2;
    this->rows = (int)uVar4;
    iVar2 = iVar2 * (int)uVar4;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = (long)iVar2 * 8;
    }
    pdVar3 = (double *)operator_new__(uVar5);
    this->data = pdVar3;
    for (iVar2 = 0; iVar2 < (int)uVar4; iVar2 = iVar2 + 1) {
      for (col = 0; col < matrix_local.cols; col = col + 1) {
        pdVar3 = operator()(&matrix_local,iVar2,col);
        dVar1 = *pdVar3;
        pdVar3 = operator()(this,iVar2,col);
        *pdVar3 = dVar1;
      }
      uVar4 = matrix_local._0_8_ & 0xffffffff;
    }
  }
  return this;
}

Assistant:

const Matrix<Type, _0, _1> & Matrix<Type, _0, _1>::operator= (const Matrix<Type, _0, _1> matrix)
{
    if(this == &matrix)
    {
        return *this;
    }
    if(this->data != NULL)
    {
        delete [] data;
    }

    this->cols = matrix.col();
    this->rows = matrix.row();
    this->data = new Type[matrix.col() * matrix.row()];
    for(int i = 0; i < matrix.row(); ++i)
       for(int j = 0; j < matrix.col(); ++j)
       {
            double tmp = matrix(i, j);
            this->operator()(i, j) = tmp;
       }
    
    return (*this);
}